

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O0

void init_options(void)

{
  int local_14;
  int local_10;
  int page_opts;
  int page;
  int opt;
  
  for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
    local_14 = 0;
    for (page_opts = 0; page_opts < 0x2d; page_opts = page_opts + 1) {
      if ((options[page_opts].type == local_10) && (local_14 < 0x15)) {
        option_page[local_10][local_14] = page_opts;
        local_14 = local_14 + 1;
      }
    }
    while (local_14 < 0x15) {
      option_page[local_10][local_14] = 0;
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void init_options(void)
{
	int opt, page;

	/* Allocate options to pages */
	for (page = 0; page < OPT_PAGE_MAX; page++) {
		int page_opts = 0;
		for (opt = 0; opt < OPT_MAX; opt++) {
			if ((options[opt].type == page) && (page_opts < OPT_PAGE_PER))
				option_page[page][page_opts++] = opt;
		}
		while (page_opts < OPT_PAGE_PER)
			option_page[page][page_opts++] = OPT_none;
	}
}